

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventDispatcher.cpp
# Opt level: O3

int __thiscall EventDispatcher::removeAll(EventDispatcher *this)

{
  int iVar1;
  TimerManager *this_00;
  SyncRetEventAgent<int> *this_01;
  ssize_t sVar2;
  void *__buf;
  int in_R8D;
  
  iVar1 = (*(this->super_IEventDispatcher)._vptr_IEventDispatcher[7])();
  if ((char)iVar1 != '\0') {
    this_00 = TimerManager::getInstance();
    TimerManager::removeTimedEvent(this_00,-1,&this->super_IEventDispatcher);
    EventQueue::Flush(&this->mQueue);
    return 0;
  }
  this_01 = (SyncRetEventAgent<int> *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventDispatcher.cpp"
                         ,0x118);
  *(undefined8 *)&this_01->field_0x8 = 0xfffffffb00000000;
  *(undefined ***)this_01 = &PTR_onRefCountZero_00130078;
  *(EventDispatcher **)(this_01 + 1) = this;
  *(undefined8 *)&this_01[1].field_0x8 = 0x31;
  *(undefined8 *)&this_01[1].field_0x10 = 0;
  *(undefined4 *)&this_01->field_0x10 = 1;
  sVar2 = SyncRetEventAgent<int>::send(this_01,(int)this,__buf,0x130078,in_R8D);
  return (int)sVar2;
}

Assistant:

int EventDispatcher::removeAll()
{
	if (not isThreadCurrent())
	{
		SyncRetEventAgent0<EventDispatcher, int>* e = 
			jh_new SyncRetEventAgent0<EventDispatcher, int>
			(this, &EventDispatcher::removeAll);

		// I am a bad person, but it's either this or make all
		// EventAgent's publicly inherit from Event (instead of
		// Protected inheritance), and that's a big ugly change for
		// little benefit.
		((Event*)e)->setPriority(PRIORITY_HIGH);

		return e->send(this);
	}

	// Same a remove exept we give TimerManager an invalid id so that he will
	//  remove all events for this dispatcher.
	TimerManager *timerMan = TimerManager::getInstance();
	timerMan->removeTimedEvent( Event::kInvalidEventId, this );
	mQueue.Flush();
	return 0;
}